

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContext.cpp
# Opt level: O0

void __thiscall
PDFHummus::DocumentContext::WriteDateState
          (DocumentContext *this,ObjectsContext *inStateWriter,PDFDate *inDate)

{
  DictionaryContext *pDVar1;
  allocator<char> local_1e9;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  allocator<char> local_171;
  string local_170;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  DictionaryContext *local_28;
  DictionaryContext *dateDictionary;
  PDFDate *inDate_local;
  ObjectsContext *inStateWriter_local;
  DocumentContext *this_local;
  
  dateDictionary = (DictionaryContext *)inDate;
  inDate_local = (PDFDate *)inStateWriter;
  inStateWriter_local = (ObjectsContext *)this;
  pDVar1 = ObjectsContext::StartDictionary(inStateWriter);
  local_28 = pDVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Type",&local_49);
  DictionaryContext::WriteKey(pDVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pDVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"Date",&local_81);
  DictionaryContext::WriteNameValue(pDVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  pDVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"Year",&local_a9);
  DictionaryContext::WriteKey(pDVar1,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  DictionaryContext::WriteIntegerValue(local_28,(long)*(int *)&dateDictionary->mObjectsContext);
  pDVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Month",&local_d1);
  DictionaryContext::WriteKey(pDVar1,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  DictionaryContext::WriteIntegerValue
            (local_28,(long)*(int *)((long)&dateDictionary->mObjectsContext + 4));
  pDVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"Day",&local_f9);
  DictionaryContext::WriteKey(pDVar1,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  DictionaryContext::WriteIntegerValue(local_28,(long)*(int *)&(dateDictionary->mKeys)._M_t._M_impl)
  ;
  pDVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"Hour",&local_121);
  DictionaryContext::WriteKey(pDVar1,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  DictionaryContext::WriteIntegerValue
            (local_28,(long)*(int *)&(dateDictionary->mKeys)._M_t._M_impl.field_0x4);
  pDVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,"Minute",&local_149);
  DictionaryContext::WriteKey(pDVar1,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  DictionaryContext::WriteIntegerValue
            (local_28,(long)(int)(dateDictionary->mKeys)._M_t._M_impl.super__Rb_tree_header.
                                 _M_header._M_color);
  pDVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"Second",&local_171);
  DictionaryContext::WriteKey(pDVar1,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator(&local_171);
  DictionaryContext::WriteIntegerValue
            (local_28,(long)*(int *)&(dateDictionary->mKeys)._M_t._M_impl.super__Rb_tree_header.
                                     _M_header.field_0x4);
  pDVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"UTC",&local_199);
  DictionaryContext::WriteKey(pDVar1,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  DictionaryContext::WriteIntegerValue
            (local_28,(ulong)*(uint *)&(dateDictionary->mKeys)._M_t._M_impl.super__Rb_tree_header.
                                       _M_header._M_parent);
  pDVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"HourFromUTC",&local_1c1);
  DictionaryContext::WriteKey(pDVar1,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  DictionaryContext::WriteIntegerValue
            (local_28,(long)*(int *)((long)&(dateDictionary->mKeys)._M_t._M_impl.
                                            super__Rb_tree_header._M_header._M_parent + 4));
  pDVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e8,"MinuteFromUTC",&local_1e9);
  DictionaryContext::WriteKey(pDVar1,&local_1e8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  DictionaryContext::WriteIntegerValue
            (local_28,(long)*(int *)&(dateDictionary->mKeys)._M_t._M_impl.super__Rb_tree_header.
                                     _M_header._M_left);
  ObjectsContext::EndDictionary((ObjectsContext *)inDate_local,local_28);
  return;
}

Assistant:

void DocumentContext::WriteDateState(ObjectsContext* inStateWriter,const PDFDate& inDate)
{
	DictionaryContext* dateDictionary = inStateWriter->StartDictionary();

	dateDictionary->WriteKey("Type");
	dateDictionary->WriteNameValue("Date");

	dateDictionary->WriteKey("Year");
	dateDictionary->WriteIntegerValue(inDate.Year);

	dateDictionary->WriteKey("Month");
	dateDictionary->WriteIntegerValue(inDate.Month);

	dateDictionary->WriteKey("Day");
	dateDictionary->WriteIntegerValue(inDate.Day);

	dateDictionary->WriteKey("Hour");
	dateDictionary->WriteIntegerValue(inDate.Hour);

	dateDictionary->WriteKey("Minute");
	dateDictionary->WriteIntegerValue(inDate.Minute);

	dateDictionary->WriteKey("Second");
	dateDictionary->WriteIntegerValue(inDate.Second);

	dateDictionary->WriteKey("UTC");
	dateDictionary->WriteIntegerValue(inDate.UTC);

	dateDictionary->WriteKey("HourFromUTC");
	dateDictionary->WriteIntegerValue(inDate.HourFromUTC);

	dateDictionary->WriteKey("MinuteFromUTC");
	dateDictionary->WriteIntegerValue(inDate.MinuteFromUTC);

	inStateWriter->EndDictionary(dateDictionary);
}